

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O1

bool __thiscall cppcms::anon_unknown_0::option::matches(option *this,string *path,char *method)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  
  if (this->match_method_ == 2) {
    if (method != (char *)0x0) {
      sVar4 = strlen(method);
      cVar1 = booster::regex::match((char *)&this->mexpr_,method,(int)sVar4 + (int)method);
      if (cVar1 != '\0') goto LAB_001dbdc9;
    }
  }
  else if ((this->match_method_ != 1) ||
          ((method != (char *)0x0 &&
           (iVar3 = std::__cxx11::string::compare((char *)&this->method_), iVar3 == 0)))) {
LAB_001dbdc9:
    bVar2 = booster::regex_match<booster::regex>
                      ((path->_M_dataplus)._M_p,&this->match_,&this->expr_,0);
    return bVar2;
  }
  return false;
}

Assistant:

bool matches(std::string const &path,char const *method)
			{
				if(match_method_==1) {
					if(!method || method_ != method)
						return false;
				}
				else if(match_method_ == 2) {
					if(!method || !booster::regex_match(method,mexpr_))
						return false;
				}
				
				return booster::regex_match(path.c_str(),match_,expr_);
			}